

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_for_do::translate
          (method_for_do *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  token_base *ptVar2;
  element_type *peVar3;
  tree_node *ptVar4;
  _Elt_pointer pdVar5;
  int iVar6;
  const_reference pptVar7;
  token_base **pptVar8;
  statement_for *this_00;
  tree_node *ptVar9;
  undefined4 extraout_var;
  _Elt_pointer pptVar10;
  internal_error *this_01;
  compile_error *pcVar11;
  ulong uVar12;
  _func_int **pp_Var13;
  long lVar14;
  ulong uVar15;
  iterator it;
  token_base *__x;
  undefined1 local_f8 [32];
  context_t local_d8;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_c8;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> local_70
  ;
  
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar7;
  local_f8._0_8_ = ptVar1[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_f8);
  if (*pptVar8 == (token_base *)0x0) {
    this_01 = (internal_error *)__cxa_allocate_exception(0x28);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Null pointer accessed.","");
    internal_error::internal_error(this_01,(string *)local_f8);
    __cxa_throw(this_01,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_f8._0_8_ = ptVar1[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_f8);
  iVar6 = (*(*pptVar8)->_vptr_token_base[2])();
  if (iVar6 != 0xf) {
    pcVar11 = (compile_error *)__cxa_allocate_exception(0x28);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               "");
    compile_error::compile_error(pcVar11,(string *)local_f8);
    __cxa_throw(pcVar11,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_f8._0_8_ = ptVar1[1]._vptr_token_base;
  pptVar8 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_f8);
  ptVar2 = *pptVar8;
  pp_Var13 = ptVar2[2]._vptr_token_base;
  if (((long)ptVar2[3]._vptr_token_base - (long)pp_Var13 >> 3) +
      ((long)((long)ptVar2[4]._vptr_token_base - ptVar2[4].line_num) >> 3) +
      (((ptVar2[5].line_num - ptVar2[3].line_num >> 3) - 1) + (ulong)(ptVar2[5].line_num == 0)) *
      0x40 != 3) {
    pcVar11 = (compile_error *)__cxa_allocate_exception(0x28);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               "");
    compile_error::compile_error(pcVar11,(string *)local_f8);
    __cxa_throw(pcVar11,&compile_error::typeinfo,compile_error::~compile_error);
  }
  lVar14 = (long)pp_Var13 - ptVar2[2].line_num;
  __x = ptVar2 + 1;
  uVar12 = lVar14 >> 3;
  if ((long)uVar12 < 0) {
    uVar15 = lVar14 >> 9;
  }
  else {
    if (uVar12 < 0x40) goto LAB_0028648c;
    uVar15 = uVar12 >> 6;
  }
  pp_Var13 = (_func_int **)
             ((uVar12 + uVar15 * -0x40) * 8 + *(long *)(ptVar2[3].line_num + uVar15 * 8));
LAB_0028648c:
  it.mData = (tree_node *)*pp_Var13;
  instance_type::check_define_var
            ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,it,
             false,false);
  this_00 = (statement_for *)statement_base::operator_new((statement_base *)0xc0,(size_t)it.mData);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  deque(&local_70,
        (deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )__x);
  ptVar9 = (tree_node *)statement_base::operator_new((statement_base *)0x28,(size_t)__x);
  pptVar7 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
  iVar6 = tree_type<cs::token_base_*>::copy
                    ((EVP_PKEY_CTX *)(*pptVar7)[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
  peVar3 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ptVar4 = (tree_node *)
           (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (ptVar4 != (tree_node *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&ptVar4->left = *(int *)&ptVar4->left + 1;
      UNLOCK();
    }
    else {
      *(int *)&ptVar4->left = *(int *)&ptVar4->left + 1;
    }
  }
  pdVar5 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar10 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar10 ==
      (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar10 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ptVar2 = pptVar10[-1];
  ptVar9->left = (tree_node *)peVar3;
  ptVar9->right = ptVar4;
  ptVar9->data = (token_base *)ptVar2->line_num;
  ptVar9->root = (tree_node *)&PTR__statement_expression_00334d40;
  ptVar9[1].root = (tree_node *)CONCAT44(extraout_var,iVar6);
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._0_8_ = ptVar9;
  std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
  _M_range_initialize<cs::statement_base*const*>
            ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_c8,local_f8);
  local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  pdVar5 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar10 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar10 ==
      (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar10 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_for::statement_for
            (this_00,&local_70,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_c8,
             &local_d8,pptVar10[-1]);
  if (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_c8);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
  ~deque(&local_70);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *
	method_for_do::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (tree.root().data()->get_type() != token_types::parallel)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
		if (parallel_list.size() != 3)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		context->instance->check_define_var(parallel_list[0].root());
		return new statement_for(parallel_list, {
			new statement_expression(static_cast<token_expr *>(raw.front().at(3))->get_tree(),
			                         context, raw.front().back())
		}, context, raw.front().back());
	}